

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifMan.c
# Opt level: O2

void If_ManSetupSet(If_Man_t *p,If_Set_t *pSet)

{
  long lVar1;
  short sVar2;
  ulong uVar3;
  long lVar4;
  
  pSet->nCuts = 0;
  sVar2 = (short)p->pPars->nCutsMax;
  uVar3 = (ulong)sVar2;
  pSet->nCutsMax = sVar2;
  pSet->ppCuts = (If_Cut_t **)(pSet + 1);
  lVar1 = uVar3 * 8;
  for (lVar4 = 0; lVar4 <= (short)uVar3; lVar4 = lVar4 + 1) {
    pSet->ppCuts[lVar4] =
         (If_Cut_t *)((long)&pSet[1].pNext + (long)(int)lVar4 * (long)p->nCutBytes + lVar1);
    If_CutSetup(p,pSet->ppCuts[lVar4]);
    uVar3 = (ulong)(ushort)pSet->nCutsMax;
  }
  return;
}

Assistant:

void If_ManSetupSet( If_Man_t * p, If_Set_t * pSet )
{
    char * pArray;
    int i;
    pSet->nCuts = 0;
    pSet->nCutsMax = p->pPars->nCutsMax;
    pSet->ppCuts = (If_Cut_t **)(pSet + 1);
    pArray = (char *)pSet->ppCuts + sizeof(If_Cut_t *) * (pSet->nCutsMax+1);
    for ( i = 0; i <= pSet->nCutsMax; i++ )
    {
        pSet->ppCuts[i] = (If_Cut_t *)(pArray + i * p->nCutBytes); 
        If_CutSetup( p, pSet->ppCuts[i] );
    }
//    pArray += (pSet->nCutsMax + 1) * p->nCutBytes;
//    assert( ((char *)pArray) - ((char *)pSet) == p->nSetBytes );
}